

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMMapping.c
# Opt level: O1

void ARM_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  undefined8 uVar3;
  _Bool _Var4;
  unsigned_short uVar5;
  uint uVar6;
  cs_struct handle;
  undefined1 auStack_c8 [104];
  cs_opt_value local_60;
  
  uVar5 = insn_find(insns,0x8a4,id,&h->insn_cache);
  if (uVar5 != 0) {
    insn->id = (uint)insns[uVar5].mapid;
    local_60 = h->detail;
    if (local_60 != CS_OPT_OFF) {
      pcVar2 = insn->detail;
      *(undefined4 *)(pcVar2->regs_read + 8) = *(undefined4 *)(insns[uVar5].regs_use + 8);
      *(undefined8 *)pcVar2->regs_read = *(undefined8 *)insns[uVar5].regs_use;
      uVar6 = count_positive(insns[uVar5].regs_use);
      pcVar2 = insn->detail;
      pcVar2->regs_read_count = (uint8_t)uVar6;
      *(undefined4 *)(pcVar2->regs_write + 0x10) = *(undefined4 *)(insns[uVar5].regs_mod + 0x10);
      uVar3 = *(undefined8 *)(insns[uVar5].regs_mod + 8);
      *(undefined8 *)pcVar2->regs_write = *(undefined8 *)insns[uVar5].regs_mod;
      *(undefined8 *)(pcVar2->regs_write + 8) = uVar3;
      uVar6 = count_positive(insns[uVar5].regs_mod);
      pcVar2 = insn->detail;
      pcVar2->regs_write_count = (uint8_t)uVar6;
      *(undefined8 *)pcVar2->groups = *(undefined8 *)insns[uVar5].groups;
      uVar6 = count_positive(insns[uVar5].groups);
      insn->detail->groups_count = (uint8_t)uVar6;
      _Var4 = cs_reg_write((csh)auStack_c8,insn,3);
      (insn->detail->field_6).arm.update_flags = _Var4;
      if ((insns[uVar5].branch != false) || (insns[uVar5].indirect_branch == true)) {
        insn->detail->groups[insn->detail->groups_count] = '\x01';
        puVar1 = &insn->detail->groups_count;
        *puVar1 = *puVar1 + '\x01';
      }
    }
  }
  return;
}

Assistant:

void ARM_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	int i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			cs_struct handle;
			handle.detail = h->detail;

			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
			insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive(insns[i].groups);

			insn->detail->arm.update_flags = cs_reg_write((csh)&handle, insn, ARM_REG_CPSR);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = ARM_GRP_JUMP;
				insn->detail->groups_count++;
			}
#endif
		}
	}
}